

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

void __thiscall
Refal2::CVariablesBuilder::CVariablesBuilder(CVariablesBuilder *this,IErrorHandler *errorHandler)

{
  CQualifier *this_00;
  long lVar1;
  
  CErrorsHelper::CErrorsHelper(&this->super_CErrorsHelper,errorHandler);
  this_00 = &this->variables[0].Qualifier;
  lVar1 = 0;
  do {
    CQualifier::CQualifier(this_00);
    lVar1 = lVar1 + -0x58;
    this_00 = (CQualifier *)(this_00[1].ansichars.super__Base_bitset<2UL>._M_w + 1);
  } while (lVar1 != -0x1600);
  this->firstFreeVariableIndex = 0;
  Reset(this);
  return;
}

Assistant:

CVariablesBuilder::CVariablesBuilder( IErrorHandler* errorHandler ):
	CErrorsHelper( errorHandler ),
	firstFreeVariableIndex( 0 )
{
	Reset();
}